

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

string * __thiscall runtime::Heap::NewString_abi_cxx11_(Heap *this)

{
  string *this_00;
  allocator<char> local_19;
  string *local_18;
  string *ret;
  Heap *this_local;
  
  ret = (string *)this;
  this_00 = (string *)operator_new(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this_00,"",&local_19);
  std::allocator<char>::~allocator(&local_19);
  local_18 = this_00;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::push_back(&this->createdStrings,&local_18);
  return local_18;
}

Assistant:

std::string* runtime::Heap::NewString() noexcept {
  auto ret = new std::string{""};
  this->createdStrings.push_back(ret);
  return ret;
}